

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

ARKRhsFn arkStep_GetImplicitRHS(void *arkode_mem)

{
  int iVar1;
  ARKRhsFn p_Var2;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_10;
  ARKodeMem local_8;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"arkStep_GetImplicitRHS",&local_8,&local_10);
  if (iVar1 == 0) {
    p_Var2 = local_10->fi;
  }
  else {
    p_Var2 = (ARKRhsFn)0x0;
  }
  return p_Var2;
}

Assistant:

ARKRhsFn arkStep_GetImplicitRHS(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure, and return fi */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_GetImplicitRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(NULL);
  return(step_mem->fi);
}